

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_glows.cxx
# Opt level: O0

void __thiscall read_glow_v13::operator()(read_glow_v13 *this,glow_data **_glow,xr_reader *r)

{
  uint16_t uVar1;
  glow_data *v;
  float fVar2;
  glow_data *glow;
  xr_reader *r_local;
  glow_data **_glow_local;
  read_glow_v13 *this_local;
  
  v = (glow_data *)operator_new(0x14);
  *_glow = v;
  xray_re::xr_reader::r_fvector3(r,(fvector3 *)v);
  fVar2 = xray_re::xr_reader::r_float(r);
  v->radius = fVar2;
  uVar1 = xray_re::xr_reader::r_u16(r);
  v->shader_id = uVar1;
  v->texture_id = uVar1;
  return;
}

Assistant:

void operator()(glow_data*& _glow, xr_reader& r) const {
	glow_data* glow = new glow_data;
	_glow = glow;
	r.r_fvector3(glow->position);
	glow->radius = r.r_float();
	glow->texture_id = glow->shader_id = r.r_u16();
}